

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O3

PCASC_FILE_NODE __thiscall
CASC_FILE_TREE::Insert
          (CASC_FILE_TREE *this,PCONTENT_KEY pCKey,char *szFullPath,DWORD DataId,DWORD FileSize,
          DWORD LocaleId)

{
  byte *pbVar1;
  ULONGLONG UVar2;
  size_t sVar3;
  byte *szNodeEnd;
  size_t nLength;
  char chOneChar;
  byte bVar4;
  char szNormPath [1025];
  PCASC_FILE_NODE local_460;
  uchar local_438 [1032];
  
  bVar4 = *szFullPath;
  local_460 = (PCASC_FILE_NODE)0x0;
  if (bVar4 != 0) {
    nLength = 0;
    sVar3 = 0;
    local_460 = (PCASC_FILE_NODE)0x0;
    pbVar1 = (byte *)(szFullPath + 1);
    do {
      szNodeEnd = pbVar1;
      if ((bVar4 - 0x2f < 0x2e) && ((0x200000000801U >> ((ulong)(bVar4 - 0x2f) & 0x3f) & 1) != 0)) {
        UVar2 = CalcNormNameHash((char *)local_438,nLength);
        local_460 = GetOrInsert(this,UVar2,szFullPath,(char *)(szNodeEnd + -1),(PCONTENT_KEY)0x0,
                                (DWORD)sVar3,0xffffffff);
        if (local_460 == (PCASC_FILE_NODE)0x0) {
          return (PCASC_FILE_NODE)0x0;
        }
        local_460->Flags = (ushort)(bVar4 == 0x3a) * 2 | local_460->Flags | 1;
        sVar3 = CASC_ARRAY::IndexOf(&this->FileTable,local_460);
        szFullPath = (char *)szNodeEnd;
      }
      local_438[nLength] = AsciiToUpperTable_BkSlash[(char)bVar4];
      nLength = nLength + 1;
      bVar4 = *szNodeEnd;
      pbVar1 = szNodeEnd + 1;
    } while (bVar4 != 0);
    if (szFullPath < szNodeEnd) {
      UVar2 = CalcNormNameHash((char *)local_438,nLength);
      local_460 = GetOrInsert(this,UVar2,szFullPath,(char *)szNodeEnd,pCKey,(DWORD)sVar3,DataId);
      if (local_460 == (PCASC_FILE_NODE)0x0) {
        local_460 = (PCASC_FILE_NODE)0x0;
      }
      else {
        if (this->FileSizeOffset != 0) {
          *(DWORD *)((local_460->CKey).Value + this->FileSizeOffset) = FileSize;
        }
        if (this->LocaleIdOffset != 0) {
          *(DWORD *)((local_460->CKey).Value + this->LocaleIdOffset) = LocaleId;
        }
      }
    }
  }
  return local_460;
}

Assistant:

PCASC_FILE_NODE CASC_FILE_TREE::Insert(PCONTENT_KEY pCKey, const char * szFullPath, DWORD DataId, DWORD FileSize, DWORD LocaleId)
{
    PCASC_FILE_NODE pFileNode = NULL;
    const char * szNodeBegin = szFullPath;
    char szNormPath[MAX_PATH+1];
    DWORD Parent = 0;
    size_t i;

    // Traverse the entire path and make sure that all subdirs are there
    for(i = 0; szFullPath[i] != 0; i++)
    {
        char chOneChar = szFullPath[i];

        // Is there a path separator?
        // Note: Warcraft III paths may contain "mount points".
        // Example: "frFR-War3Local.mpq:Maps/FrozenThrone/Campaign/NightElfX06Interlude.w3x:war3map.j"
        if(chOneChar == '\\' || chOneChar == '/' || chOneChar == ':')
        {
            pFileNode = GetOrInsert(szNormPath, i, szNodeBegin, szFullPath + i, NULL, Parent, CASC_INVALID_ID);
            if(pFileNode == NULL)
                return NULL;

            // Supply the missing values
            pFileNode->Flags |= (chOneChar == ':') ? CFN_FLAG_MOUNT_POINT : 0;
            pFileNode->Flags |= CFN_FLAG_FOLDER;

            // Get the new parent item
            Parent = (DWORD)FileTable.IndexOf(pFileNode);

            // Also reset the begin of the node
            szNodeBegin = szFullPath + i + 1;
        }

        // Copy the next character, even if it was slash/backslash before
        szNormPath[i] = AsciiToUpperTable_BkSlash[chOneChar];
    }

    // If there is anything left, we insert it as file name
    if((szFullPath + i) > szNodeBegin)
    {
        pFileNode = GetOrInsert(szNormPath, i, szNodeBegin, szFullPath + i, pCKey, Parent, DataId);
        if(pFileNode != NULL)
        {
            SetExtras(pFileNode, FileSize, LocaleId);
        }
    }

    // Return the file node
    return pFileNode;
}